

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdateFactor(HEkkDual *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long in_RDI;
  bool performed_min_updates;
  bool reinvert_syntheticClock;
  double use_build_synthetic_tick;
  HighsInt *in_stack_00000020;
  HighsInt iCh;
  HighsInt *iRows;
  HVector *in_stack_00000038;
  HEkk *in_stack_00000040;
  undefined4 local_14;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*(int *)(in_RDI + 0x14cc);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x14cc) + -1; local_14 = local_14 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + (long)local_14 * 0x78 + 0x2778) + 0x70) =
         *(undefined8 *)(in_RDI + (long)(local_14 + 1) * 0x78 + 0x2778);
    *(undefined8 *)(*(long *)(in_RDI + (long)local_14 * 0x78 + 0x2780) + 0x70) =
         *(undefined8 *)(in_RDI + (long)(local_14 + 1) * 0x78 + 0x2780);
    *(undefined4 *)((long)pvVar3 + (long)local_14 * 4) =
         *(undefined4 *)(in_RDI + (long)local_14 * 0x78 + 0x2740);
  }
  *(undefined4 *)((long)pvVar3 + (long)(*(int *)(in_RDI + 0x14cc) + -1) * 4) =
       *(undefined4 *)(in_RDI + (long)(*(int *)(in_RDI + 0x14cc) + -1) * 0x78 + 0x2740);
  if (0 < *(int *)(in_RDI + 0x14cc)) {
    HEkk::updateFactor(in_stack_00000040,in_stack_00000038,(HVector *)this,iRows,in_stack_00000020);
  }
  if ((*(double *)(*(long *)(in_RDI + 0x10) + 0x3850) * 1.0 <=
       *(double *)(*(long *)(in_RDI + 0x10) + 0x3858)) &&
     (0x31 < *(int *)(*(long *)(in_RDI + 0x10) + 0x2944))) {
    *(undefined4 *)(in_RDI + 0xe8) = 2;
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdateFactor() {
  /**
   * 9. Update the factor by CFT
   */
  HighsInt* iRows = new HighsInt[multi_nFinish];
  for (HighsInt iCh = 0; iCh < multi_nFinish - 1; iCh++) {
    multi_finish[iCh].row_ep->next = multi_finish[iCh + 1].row_ep;
    multi_finish[iCh].col_aq->next = multi_finish[iCh + 1].col_aq;
    iRows[iCh] = multi_finish[iCh].row_out;
  }
  iRows[multi_nFinish - 1] = multi_finish[multi_nFinish - 1].row_out;
  if (multi_nFinish > 0)
    ekk_instance_.updateFactor(multi_finish[0].col_aq, multi_finish[0].row_ep,
                               iRows, &rebuild_reason);

  // Determine whether to reinvert based on the synthetic clock
  const double use_build_synthetic_tick =
      ekk_instance_.build_synthetic_tick_ * kMultiBuildSyntheticTickMu;
  const bool reinvert_syntheticClock =
      ekk_instance_.total_synthetic_tick_ >= use_build_synthetic_tick;
  const bool performed_min_updates =
      ekk_instance_.info_.update_count >=
      kMultiSyntheticTickReinversionMinUpdateCount;
  if (reinvert_syntheticClock && performed_min_updates)
    rebuild_reason = kRebuildReasonSyntheticClockSaysInvert;

  delete[] iRows;
}